

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImGuiNavLayer nav_layer;
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  byte in_SIL;
  undefined8 *in_RDI;
  bool init_for_nav;
  ImGuiContext *g;
  ImGuiID focus_scope_id;
  float in_stack_ffffffffffffffc4;
  float fStack_38;
  ImVec2 local_34;
  ImRect local_2c;
  byte local_19;
  ImGuiContext *local_18;
  byte local_9;
  undefined8 *local_8;
  
  pIVar2 = GImGui;
  local_9 = in_SIL & 1;
  local_18 = GImGui;
  if ((*(uint *)((long)in_RDI + 0xc) & 0x40000) == 0) {
    local_19 = 0;
    if ((((in_RDI == (undefined8 *)in_RDI[0x6b]) ||
         ((*(uint *)((long)in_RDI + 0xc) & 0x4000000) != 0)) || (*(int *)(in_RDI + 0x70) == 0)) ||
       (local_9 != 0)) {
      local_19 = 1;
    }
    local_8 = in_RDI;
    if ((GImGui->DebugLogFlags & 8U) != 0) {
      DebugLog("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n"
               ,(ulong)local_19,*in_RDI,(ulong)GImGui->NavLayer);
    }
    if ((local_19 & 1) == 0) {
      local_18->NavId = *(ImGuiID *)(local_8 + 0x70);
      local_18->NavFocusScopeId = *(ImGuiID *)(local_8 + 0x75);
    }
    else {
      nav_layer = local_18->NavLayer;
      focus_scope_id = *(ImGuiID *)(local_8 + 0x75);
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffffc4,focus_scope_id));
      SetNavID(0,nav_layer,focus_scope_id,&local_2c);
      local_18->NavInitRequest = true;
      local_18->NavInitRequestFromMove = false;
      local_18->NavInitResultId = 0;
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffffc4,focus_scope_id));
      IVar1.y = fStack_38;
      IVar1.x = in_stack_ffffffffffffffc4;
      (local_18->NavInitResultRectRel).Min = IVar1;
      (local_18->NavInitResultRectRel).Max = local_34;
      NavUpdateAnyRequestFlag();
    }
  }
  else {
    GImGui->NavId = 0;
    pIVar2->NavFocusScopeId = *(ImGuiID *)(in_RDI + 0x75);
  }
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);

    if (window->Flags & ImGuiWindowFlags_NoNavInputs)
    {
        g.NavId = 0;
        g.NavFocusScopeId = window->NavRootFocusScopeId;
        return;
    }

    bool init_for_nav = false;
    if (window == window->RootWindow || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
        init_for_nav = true;
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n", init_for_nav, window->Name, g.NavLayer);
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer, window->NavRootFocusScopeId, ImRect());
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResultId = 0;
        g.NavInitResultRectRel = ImRect();
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
        g.NavFocusScopeId = window->NavRootFocusScopeId;
    }
}